

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndex
          (ConfidentialTransaction *this,Script *locking_script)

{
  undefined4 uVar1;
  __type _Var2;
  size_type sVar3;
  const_reference this_00;
  CfdException *this_01;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  uint local_b0;
  Script local_a0;
  undefined1 local_68 [8];
  string script;
  undefined1 local_40 [4];
  uint32_t index;
  string search_str;
  Script *locking_script_local;
  ConfidentialTransaction *this_local;
  
  search_str.field_2._8_8_ = locking_script;
  Script::GetHex_abi_cxx11_((string *)local_40,locking_script);
  script.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = script.field_2._12_4_;
    sVar3 = ::std::
            vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
            size(&this->vout_);
    if ((uint)sVar3 <= (uint)uVar1) {
      local_c8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_c8.filename = local_c8.filename + 1;
      local_c8.line = 0x5c7;
      local_c8.funcname = "GetTxOutIndex";
      logger::warn<>(&local_c8,"locking script is not found.");
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_e8,"locking script is not found.",&local_e9);
      CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_e8);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this_00 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              operator[](&this->vout_,(ulong)(uint)script.field_2._12_4_);
    AbstractTxOut::GetLockingScript(&local_a0,&this_00->super_AbstractTxOut);
    Script::GetHex_abi_cxx11_((string *)local_68,&local_a0);
    Script::~Script(&local_a0);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_40);
    if (_Var2) {
      this_local._4_4_ = script.field_2._12_4_;
    }
    local_b0 = (uint)_Var2;
    ::std::__cxx11::string::~string((string *)local_68);
    if (local_b0 != 0) break;
    script.field_2._12_4_ = script.field_2._12_4_ + 1;
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

uint32_t ConfidentialTransaction::GetTxOutIndex(
    const Script &locking_script) const {
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    std::string script = vout_[index].GetLockingScript().GetHex();
    if (script == search_str) {
      return index;
    }
  }
  warn(CFD_LOG_SOURCE, "locking script is not found.");
  throw CfdException(kCfdIllegalArgumentError, "locking script is not found.");
}